

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * makeTempDir_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  char *__path;
  int *piVar4;
  void *this;
  string *in_RDI;
  int status;
  int i;
  Rand48 rand48;
  string *tempDir;
  unsigned_long in_stack_ffffffffffffff88;
  Rand48 *in_stack_ffffffffffffff90;
  int local_20;
  
  std::__cxx11::string::string((string *)in_RDI);
  time((time_t *)0x0);
  Imath_3_2::Rand48::Rand48(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  while( true ) {
    std::__cxx11::string::operator=((string *)in_RDI,"/var/tmp/OpenEXRTest_");
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      lVar2 = Imath_3_2::Rand48::nexti((Rand48 *)0x12893c);
      std::__cxx11::string::operator+=
                ((string *)in_RDI,
                 (char)lVar2 +
                 ((char)(SUB168(SEXT816(lVar2) * SEXT816(0x4ec4ec4ec4ec4ec5),8) >> 3) -
                 (SUB161(SEXT816(lVar2) * SEXT816(0x4ec4ec4ec4ec4ec5),0xf) >> 7)) * -0x1a + 'A');
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"tempDir = ");
    poVar3 = std::operator<<(poVar3,(string *)in_RDI);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __path = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(__path,0x1ff);
    if (iVar1 == 0) break;
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR -- mkdir(");
      poVar3 = std::operator<<(poVar3,(string *)in_RDI);
      poVar3 = std::operator<<(poVar3,") failed: errno = ");
      piVar4 = __errno_location();
      this = (void *)std::ostream::operator<<(poVar3,*piVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"/");
  return in_RDI;
}

Assistant:

string
makeTempDir ()
{
    string tempDir;

    IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
    while (true)
    {
#ifdef _WIN32
        char  tmpbuf[4096];
        DWORD len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            cerr << "Cannot retrieve temporary directory" << endl;
            exit (1);
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";
#else
        tempDir = IMF_TMP_DIR "OpenEXRTest_";
#endif
        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        std::cout << "tempDir = " << tempDir << std::endl;

        int status = mkdir (tempDir.c_str (), 0777);

        if (status == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;
            break; // success
        }

        if (errno != EEXIST)
        {
            std::cerr << "ERROR -- mkdir(" << tempDir
                      << ") failed: "
                         "errno = "
                      << errno << std::endl;
            exit (1);
        }
    }

    return tempDir;
}